

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

array<unsigned_char,_4UL> string2byte<4u>(string *s,int base,char sep)

{
  uint8_t uVar1;
  array<unsigned_char,_4UL> aVar2;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  uint8_t *puVar5;
  array<unsigned_char,_4UL> result;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  splitted;
  _Type local_b0;
  int local_ac;
  anon_class_8_1_8989b3cf local_a8;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  local_a0;
  
  local_ac = base;
  split<4u>(&local_a0,s,sep);
  puVar5 = local_b0;
  lVar3 = 0;
  local_a8.base = &local_ac;
  do {
    uVar1 = string2byte<4U>::anon_class_8_1_8989b3cf::operator()
                      (&local_a8,(string *)((long)&local_a0._M_elems[0]._M_dataplus._M_p + lVar3));
    *puVar5 = uVar1;
    lVar3 = lVar3 + 0x20;
    puVar5 = puVar5 + 1;
  } while (lVar3 != 0x80);
  lVar3 = -0x80;
  paVar4 = &local_a0._M_elems[3].field_2;
  do {
    if (paVar4 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar4->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar4->_M_allocated_capacity)[-2],paVar4->_M_allocated_capacity + 1
                     );
    }
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar4->_M_allocated_capacity + -4);
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  aVar2._M_elems[0] = local_b0[0];
  aVar2._M_elems[1] = local_b0[1];
  aVar2._M_elems[2] = local_b0[2];
  aVar2._M_elems[3] = local_b0[3];
  return (array<unsigned_char,_4UL>)aVar2._M_elems;
}

Assistant:

std::array<uint8_t, n> string2byte(const std::string& s,
                                   const int base,
                                   const char sep)
{
  const auto splitted = split<n>(s, sep);

  std::array<uint8_t, n> result;

  std::transform(std::begin(splitted),
                 std::end(splitted),
                 std::begin(result),
                 [&base](const std::string& s) -> std::uint8_t
  {
    const auto v = std::stoul(s, nullptr, base);
    if (v > 255)
    {
      throw std::out_of_range("number is larger than 255");
    }
    return static_cast<std::uint8_t>(v);
  });

  return result;
}